

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::nameEnv(GrpParser *this)

{
  int iVar1;
  int t;
  undefined8 uVar2;
  RefToken *tok;
  NoViableAltException *in_RDI;
  GrpParser *in_stack_00000050;
  GrpParser *in_stack_00000060;
  ParserException *ex;
  RefAST tmp67_AST;
  RefAST tmp66_AST;
  RefAST tmp65_AST;
  RefAST tmp64_AST;
  RefAST nameEnv_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  ASTPair *in_stack_fffffffffffffe90;
  RefToken *this_00;
  RefToken *in_stack_fffffffffffffe98;
  RefToken *in_stack_fffffffffffffea0;
  RefAST *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Parser *in_stack_fffffffffffffec0;
  ASTPair *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  RefToken *t_00;
  undefined1 local_e0 [8];
  undefined1 local_d8 [24];
  GrpParser *in_stack_ffffffffffffff40;
  undefined1 local_88 [8];
  undefined1 local_80 [31];
  undefined1 local_61;
  undefined1 local_60 [24];
  undefined1 local_48 [56];
  GrpParser *in_stack_fffffffffffffff0;
  
  RefCount<AST>::operator=
            ((RefCount<AST> *)in_stack_fffffffffffffea0,(RefCount<AST> *)in_stack_fffffffffffffe98);
  ASTPair::ASTPair(in_stack_fffffffffffffe90);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe90->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe90->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  t_00 = &in_RDI->token;
  (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
            (local_48,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (RefToken *)in_stack_fffffffffffffeb0);
  RefCount<AST>::operator=
            ((RefCount<AST> *)in_stack_fffffffffffffea0,(RefCount<AST> *)in_stack_fffffffffffffe98);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe90->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  ASTFactory::makeASTRoot
            ((ASTFactory *)in_stack_fffffffffffffec0,
             (ASTPair *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb0);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
  Parser::match(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  iVar1 = (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x20))
                    (in_RDI,1);
  if (2 < iVar1 - 8U) {
    if (iVar1 == 0xb) {
      directives(in_stack_ffffffffffffff40);
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe90->root,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      ASTFactory::addASTChild
                ((ASTFactory *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8,(RefAST *)in_stack_fffffffffffffec0);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    }
    else if ((1 < iVar1 - 0xdU) && (iVar1 != 0x11)) {
      local_61 = 1;
      uVar2 = __cxa_allocate_exception(0x40);
      (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
                (local_60,in_RDI,1);
      NoViableAltException::NoViableAltException(in_RDI,t_00);
      local_61 = 0;
      __cxa_throw(uVar2,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
  }
  iVar1 = (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x20))
                    (in_RDI,1);
  if (iVar1 == 8) {
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe90->root,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    in_stack_fffffffffffffec8 = (ASTPair *)&in_RDI->token;
    (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
              (local_80,in_RDI,1);
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                       (RefToken *)in_stack_fffffffffffffeb0);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffea0,(RefCount<AST> *)in_stack_fffffffffffffe98
              );
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
    Parser::match(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
  }
  else if (((1 < iVar1 - 9U) && (1 < iVar1 - 0xdU)) && (iVar1 != 0x11)) {
    uVar2 = __cxa_allocate_exception(0x40);
    (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
              (local_88,in_RDI,1);
    NoViableAltException::NoViableAltException(in_RDI,t_00);
    __cxa_throw(uVar2,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  do {
    t = (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x20))
                  (in_RDI,1);
    tok = (RefToken *)(ulong)(t - 9);
    switch(tok) {
    case (RefToken *)0x0:
      nameEnv(in_stack_fffffffffffffff0);
      in_stack_fffffffffffffea0 = &in_RDI->token;
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe90->root,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      ASTFactory::addASTChild
                ((ASTFactory *)CONCAT44(iVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8,
                 (RefAST *)in_stack_fffffffffffffec0);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
      break;
    default:
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe90->root,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      this_00 = &in_RDI->token;
      (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
                (&stack0xffffffffffffff40,in_RDI,1);
      ASTFactory::create((ASTFactory *)CONCAT44(t,in_stack_fffffffffffffeb8),tok);
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffea0,
                 (RefCount<AST> *)in_stack_fffffffffffffe98);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
      RefCount<Token>::~RefCount(this_00);
      Parser::match(in_stack_fffffffffffffec0,t);
      iVar1 = (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x20))
                        (in_RDI,1);
      if (iVar1 == 8) {
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)this_00,(RefCount<AST> *)CONCAT44(8,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffe80 = (ASTPair *)&in_RDI->token;
        (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
                  (local_d8,in_RDI,1);
        ASTFactory::create((ASTFactory *)CONCAT44(t,in_stack_fffffffffffffeb8),tok);
        RefCount<AST>::operator=
                  ((RefCount<AST> *)in_stack_fffffffffffffea0,
                   (RefCount<AST> *)in_stack_fffffffffffffe98);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
        RefCount<Token>::~RefCount(this_00);
        Parser::match(in_stack_fffffffffffffec0,t);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
      }
      else if (((1 < iVar1 - 9U) && (2 < iVar1 - 0xdU)) && (iVar1 != 0x11)) {
        uVar2 = __cxa_allocate_exception(0x40);
        (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
                  (local_e0,in_RDI,1);
        NoViableAltException::NoViableAltException(in_RDI,t_00);
        __cxa_throw(uVar2,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffea0,
                 (RefCount<AST> *)in_stack_fffffffffffffe98);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffea0,
                 (RefCount<AST> *)in_stack_fffffffffffffe98);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
      ASTPair::~ASTPair(in_stack_fffffffffffffe80);
      return;
    case (RefToken *)0x4:
    case (RefToken *)0x8:
      nameSpecList(in_stack_00000050);
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe90->root,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      ASTFactory::addASTChild
                ((ASTFactory *)CONCAT44(iVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8,
                 (RefAST *)in_stack_fffffffffffffec0);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
      break;
    case (RefToken *)0x5:
      tableDecl(in_stack_00000060);
      in_stack_fffffffffffffe98 = &in_RDI->token;
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe90->root,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      ASTFactory::addASTChild
                ((ASTFactory *)CONCAT44(iVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8,
                 (RefAST *)in_stack_fffffffffffffec0);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    }
  } while( true );
}

Assistant:

void GrpParser::nameEnv() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST nameEnv_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp64_AST = nullAST;
		tmp64_AST = astFactory.create(LT(1));
		astFactory.makeASTRoot(currentAST, tmp64_AST);
		match(LITERAL_environment);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			directives();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_SEMI:
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LIT_INT:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp65_AST = nullAST;
			tmp65_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LIT_INT:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		do {
			switch ( LA(1)) {
			case IDENT:
			case LIT_INT:
			{
				nameSpecList();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_environment:
			{
				nameEnv();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_table:
			{
				tableDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			default:
			{
				goto _loop35;
			}
			}
		} while (true);
		_loop35:;
		}
		RefAST tmp66_AST = nullAST;
		tmp66_AST = astFactory.create(LT(1));
		match(LITERAL_endenvironment);
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp67_AST = nullAST;
			tmp67_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LIT_INT:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		nameEnv_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_14);
	}
	returnAST = nameEnv_AST;
}